

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  ostream *poVar3;
  istream *piVar4;
  size_t sVar5;
  int iVar6;
  bool bVar7;
  string program;
  string line;
  Tokenizer tokenizer;
  ifstream file;
  undefined1 *local_3a8;
  long local_3a0;
  undefined1 local_398;
  undefined7 uStack_397;
  undefined1 *local_388;
  long local_380;
  undefined1 local_378;
  undefined7 uStack_377;
  tokenValue *local_368;
  string local_360;
  Token local_340;
  Token local_310;
  Tokenizer local_2e0;
  long local_238 [65];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ReqLang Interpreter",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"  Usage: reqlang file.req <flags>",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  Flags:",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    -v : Verbose output",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    iVar6 = 0;
  }
  else {
    if (((argc == 2) || (pcVar1 = argv[2], *pcVar1 != '-')) || (pcVar1[1] != 'v')) {
      bVar7 = false;
    }
    else {
      bVar7 = pcVar1[2] == '\0';
    }
    std::ifstream::ifstream((istream *)local_238);
    std::ifstream::open((char *)local_238,(_Ios_Openmode)argv[1]);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No file found (",0xf);
      pcVar1 = argv[1];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x124358);
      }
      else {
        sVar5 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar5);
      }
      iVar6 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")",1);
    }
    else {
      local_3a8 = &local_398;
      local_3a0 = 0;
      local_398 = 0;
      local_388 = &local_378;
      local_380 = 0;
      local_378 = 0;
      while( true ) {
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_388,cVar2);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        local_2e0._0_8_ = (long)&local_2e0 + 0x10U;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_388,local_388 + local_380);
        std::__cxx11::string::append((char *)&local_2e0);
        std::__cxx11::string::_M_append((char *)&local_3a8,local_2e0._0_8_);
        if (local_2e0._0_8_ != (long)&local_2e0 + 0x10U) {
          operator_delete((void *)local_2e0._0_8_,
                          (ulong)(local_2e0.current_line._M_dataplus._M_p + 1));
        }
      }
      std::__cxx11::string::pop_back();
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[TOK] Starting",0xe);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
      }
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_360,local_3a8,local_3a8 + local_3a0);
      Tokenizer::Tokenizer(&local_2e0,&local_360);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      local_340.type = Empty;
      local_340.value.
      super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>._M_u.
      _M_first._M_storage = (_Uninitialized<int,_true>)0;
      local_340.value.
      super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      _M_index = 0;
      do {
        Tokenizer::getNextToken(&local_310,&local_2e0);
        local_340.type = local_310.type;
        local_368 = &local_340.value;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
          ::_S_vtable._M_arr
          [local_310.value.
           super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
           .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           _M_index]._M_data)((anon_class_8_1_8991fb9c *)&local_368,&local_310.value);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
          ::_S_vtable._M_arr
          [local_310.value.
           super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
           .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
           _M_index]._M_data)((anon_class_1_0_00000001 *)&local_368,&local_310.value);
        poVar3 = operator<<((ostream *)&std::cout,&local_340);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      } while (local_340.type != Eof);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
        ::_S_vtable._M_arr
        [local_340.value.
         super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
         .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         _M_index]._M_data)((anon_class_1_0_00000001 *)&local_310,&local_340.value);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
        ::_S_vtable._M_arr
        [local_2e0.currentToken.value.
         super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
         .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
         _M_index]._M_data)
                ((anon_class_1_0_00000001 *)&local_340,
                 (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  *)((long)&local_2e0 + 0x80));
      local_2e0.currentToken.value.
      super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      _M_index = 0xff;
      if (local_2e0.program._M_dataplus._M_p != (pointer)((long)&local_2e0 + 0x68U)) {
        operator_delete(local_2e0.program._M_dataplus._M_p,
                        local_2e0.program.field_2._M_allocated_capacity + 1);
      }
      if (local_2e0.header_block_name._M_dataplus._M_p != (pointer)((long)&local_2e0 + 0x48U)) {
        operator_delete(local_2e0.header_block_name._M_dataplus._M_p,
                        local_2e0.header_block_name.field_2._M_allocated_capacity + 1);
      }
      if (local_2e0.current_line._M_dataplus._M_p != (pointer)((long)&local_2e0 + 0x20U)) {
        operator_delete(local_2e0.current_line._M_dataplus._M_p,
                        local_2e0.current_line.field_2._M_allocated_capacity + 1);
      }
      if (local_388 != &local_378) {
        operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
      }
      iVar6 = 0;
    }
    std::ifstream::~ifstream(local_238);
  }
  return iVar6;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2) {
        cout << "ReqLang Interpreter" << endl
             << "  Usage: reqlang file.req <flags>" << endl
             << "  Flags:" << endl
             << "    -v : Verbose output" << endl;
        return 0;
    }

    bool verbose = argc > 2 && strcmp(argv[2], "-v") == 0;

    ifstream file;
    file.open(argv[1]);
    if (!file.is_open()) {
        cerr << "No file found (" << argv[1] << ")";
        return 1;
    }

    string program;
    string line;
    while (getline(file, line)) {
        program += line + "\n";
    }
    program.pop_back();

    if (verbose) cout << "[TOK] Starting" << endl;

    Tokenizer tokenizer = Tokenizer(program);
    Token t;
    do {
        t = tokenizer.getNextToken();
        cout << t << endl;
    } while (t.type != Eof);

    return 0;
}